

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O1

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::GetCachedOrAdd
          (ScalarEvolutionAnalysis *this,
          unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
          *prospective_node)

{
  iterator iVar1;
  __hashtable *__h;
  SENode *pSVar2;
  __node_gen_type __node_gen;
  
  iVar1 = std::
          _Hashtable<std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>,_std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>,_std::allocator<std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>_>,_std::__detail::_Identity,_spvtools::opt::ScalarEvolutionAnalysis::NodePointersEquality,_spvtools::opt::SENodeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&(this->node_cache_)._M_h,prospective_node);
  if (iVar1.
      super__Node_iterator_base<std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    pSVar2 = (prospective_node->_M_t).
             super___uniq_ptr_impl<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
             .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl;
    std::
    _Hashtable<std::unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>>,std::unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>>,std::allocator<std::unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>>>,std::__detail::_Identity,spvtools::opt::ScalarEvolutionAnalysis::NodePointersEquality,spvtools::opt::SENodeHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>>,true>>>>
              ((_Hashtable<std::unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>>,std::unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>>,std::allocator<std::unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>>>,std::__detail::_Identity,spvtools::opt::ScalarEvolutionAnalysis::NodePointersEquality,spvtools::opt::SENodeHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&this->node_cache_,prospective_node);
  }
  else {
    pSVar2 = *(SENode **)
              ((long)iVar1.
                     super__Node_iterator_base<std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>,_true>
                     ._M_cur + 8);
  }
  return pSVar2;
}

Assistant:

SENode* ScalarEvolutionAnalysis::GetCachedOrAdd(
    std::unique_ptr<SENode> prospective_node) {
  auto itr = node_cache_.find(prospective_node);
  if (itr != node_cache_.end()) {
    return (*itr).get();
  }

  SENode* raw_ptr_to_node = prospective_node.get();
  node_cache_.insert(std::move(prospective_node));
  return raw_ptr_to_node;
}